

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_main.c
# Opt level: O3

int format_seg(char *outptr,int len,ps_seg_t *seg,double utt_start,int frate,logmath_t *lmath)

{
  int32 logb_p;
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  float64 fVar4;
  int ef;
  int sf;
  int local_38;
  int local_34;
  
  ps_seg_frames(seg,&local_34,&local_38);
  pcVar2 = ps_seg_word(seg);
  pcVar3 = "";
  if (pcVar2 != (char *)0x0) {
    pcVar3 = pcVar2;
  }
  logb_p = ps_seg_prob(seg,(int32 *)0x0,(int32 *)0x0,(int32 *)0x0);
  fVar4 = logmath_exp(lmath,logb_p);
  iVar1 = snprintf(outptr,(ulong)(uint)len,"{\"b\":%.3f,\"d\":%.3f,\"p\":%.3f,\"t\":\"%s\"",
                   (double)local_34 / (double)frate + utt_start,
                   (double)((local_38 - local_34) + 1) / (double)frate,fVar4,pcVar3);
  if (outptr != (char *)0x0) {
    (outptr + iVar1)[0] = '}';
    (outptr + iVar1)[1] = '\0';
  }
  return iVar1 + 1;
}

Assistant:

static int
format_seg(char *outptr, int len, ps_seg_t *seg,
           double utt_start, int frate,
           logmath_t *lmath)
{
    double prob, st, dur;
    int sf, ef;
    const char *word;

    ps_seg_frames(seg, &sf, &ef);
    st = utt_start + (double)sf / frate;
    dur = (double)(ef + 1 - sf) / frate;
    word = ps_seg_word(seg);
    if (word == NULL)
        word = "";
    prob = logmath_exp(lmath, ps_seg_prob(seg, NULL, NULL, NULL));
    len = snprintf(outptr, len, HYP_FORMAT, st, dur, prob, word);
    if (outptr) {
        outptr += len;
        *outptr++ = '}';
        *outptr = '\0';
    }
    len++;
    return len;
}